

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O1

void ldisc_check_sendok_callback(void *ctx)

{
  bufchain *ch;
  long *plVar1;
  char cVar2;
  size_t sVar3;
  void *__s;
  void *pvVar4;
  ptrlen pVar5;
  LdiscInputToken local_40;
  
  if (*(long **)((long)ctx + 8) != (long *)0x0) {
    cVar2 = (**(code **)(**(long **)((long)ctx + 8) + 0x50))();
    if (cVar2 != '\0') {
      ch = (bufchain *)((long)ctx + 0x18);
      sVar3 = bufchain_size(ch);
      if (sVar3 != 0) {
        do {
          pVar5 = bufchain_prefix(ch);
          __s = pVar5.ptr;
          pvVar4 = memchr(__s,-1,pVar5.len);
          if ((long)pvVar4 - (long)__s == 0) {
            local_40 = ldisc_get_input_token((Ldisc *)ctx);
            plVar1 = *(long **)((long)ctx + 8);
            if (((undefined1  [12])local_40 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
              (**(code **)(*plVar1 + 0x18))(plVar1,&local_40.field_1,1);
            }
            else {
              (**(code **)(*plVar1 + 0x30))(plVar1,local_40.field_1.field_1.code);
            }
          }
          else {
            sVar3 = (long)pvVar4 - (long)__s;
            if (pvVar4 == (void *)0x0) {
              sVar3 = pVar5.len;
            }
            (**(code **)(**(long **)((long)ctx + 8) + 0x18))(*(long **)((long)ctx + 8),__s,sVar3);
            bufchain_consume(ch,sVar3);
          }
          sVar3 = bufchain_size(ch);
        } while (sVar3 != 0);
      }
    }
  }
  return;
}

Assistant:

static void ldisc_check_sendok_callback(void *ctx)
{
    Ldisc *ldisc = (Ldisc *)ctx;

    if (!(ldisc->backend && backend_sendok(ldisc->backend)))
        return;

    /*
     * Flush the ldisc input queue into the backend, which is now
     * willing to receive the data.
     */
    while (bufchain_size(&ldisc->input_queue) > 0) {
        /*
         * Process either a chunk of non-special data, or an FF
         * escape, depending on whether the first thing we see is an
         * FF byte.
         */
        ptrlen data = bufchain_prefix(&ldisc->input_queue);
        const char *ff = memchr(data.ptr, '\xFF', data.len);
        if (ff != data.ptr) {
            /* Send a maximal block of data not containing any
             * difficult bytes. */
            if (ff)
                data.len = ff - (const char *)data.ptr;
            backend_send(ldisc->backend, data.ptr, data.len);
            bufchain_consume(&ldisc->input_queue, data.len);
        } else {
            /* Decode either a special or an escaped FF byte. The
             * easiest way to do this is to reuse the decoding code
             * already in ldisc_get_input_token. */
            LdiscInputToken tok = ldisc_get_input_token(ldisc);
            if (tok.is_special)
                backend_special(ldisc->backend, tok.code, tok.arg);
            else
                backend_send(ldisc->backend, &tok.chr, 1);
        }
    }
}